

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextVkImpl.cpp
# Opt level: O3

void __thiscall
Diligent::DeviceContextVkImpl::UnmapBuffer
          (DeviceContextVkImpl *this,IBuffer *pBuffer,MAP_TYPE MapType)

{
  byte bVar1;
  pointer pMVar2;
  ulong uVar3;
  char (*in_R8) [34];
  ulong uVar4;
  string msg;
  string local_50;
  
  DeviceContextBase<Diligent::EngineVkImplTraits>::UnmapBuffer
            ((DeviceContextBase<Diligent::EngineVkImplTraits> *)this,pBuffer,MapType);
  if (pBuffer != (IBuffer *)0x0) {
    CheckDynamicType<Diligent::BufferVkImpl,Diligent::IBuffer>(pBuffer);
  }
  if (MapType == MAP_WRITE) {
    bVar1 = *(byte *)((long)&pBuffer[5].super_IDeviceObject.super_IObject._vptr_IObject + 4);
    if (bVar1 - 3 < 2) {
      if (((ulong)pBuffer[0xb].super_IDeviceObject.super_IObject._vptr_IObject & 0x100000000) == 0)
      {
        BufferVkImpl::FlushMappedRange
                  ((BufferVkImpl *)pBuffer,0,
                   (Uint64)pBuffer[4].super_IDeviceObject.super_IObject._vptr_IObject);
        return;
      }
    }
    else if ((bVar1 == 2) &&
            (pBuffer[0x15].super_IDeviceObject.super_IObject._vptr_IObject != (_func_int **)0x0)) {
      uVar4 = (ulong)*(uint *)&pBuffer[0xc].super_IDeviceObject.super_IObject._vptr_IObject;
      if (uVar4 == 0xffffffff) {
        FormatString<char[17],char_const*,char[34]>
                  (&local_50,(Diligent *)"Dynamic buffer \'",(char (*) [17])(pBuffer + 3),
                   (char **)"\' does not have dynamic buffer ID",in_R8);
        DebugAssertionFailed
                  (local_50._M_dataplus._M_p,"UnmapBuffer",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
                   ,0x8de);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
      }
      pMVar2 = (this->m_MappedBuffers).
               super__Vector_base<Diligent::DeviceContextVkImpl::MappedBuffer,_std::allocator<Diligent::DeviceContextVkImpl::MappedBuffer>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar3 = ((long)(this->m_MappedBuffers).
                     super__Vector_base<Diligent::DeviceContextVkImpl::MappedBuffer,_std::allocator<Diligent::DeviceContextVkImpl::MappedBuffer>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (long)pMVar2 >> 3) *
              -0x3333333333333333;
      if (uVar3 < uVar4 || uVar3 - uVar4 == 0) {
        FormatString<char[19],char_const*,char[34]>
                  (&local_50,(Diligent *)"Unmapping buffer \'",(char (*) [19])(pBuffer + 3),
                   (char **)"\' that was not previously mapped.",in_R8);
        DebugAssertionFailed
                  (local_50._M_dataplus._M_p,"UnmapBuffer",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
                   ,0x8e7);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
      }
      else {
        UpdateBufferRegion(this,(BufferVkImpl *)pBuffer,0,
                           (Uint64)pBuffer[4].super_IDeviceObject.super_IObject._vptr_IObject,
                           *(VkBuffer_T **)
                            ((long)&(pMVar2[uVar4].Allocation.pDynamicMemMgr)->m_VkBuffer + 0x10),
                           pMVar2[uVar4].Allocation.AlignedOffset,
                           RESOURCE_STATE_TRANSITION_MODE_TRANSITION);
      }
    }
  }
  else if (((MapType == MAP_READ) &&
           ((byte)(*(char *)((long)&pBuffer[5].super_IDeviceObject.super_IObject._vptr_IObject + 4)
                  - 3U) < 2)) &&
          (((ulong)pBuffer[0xb].super_IDeviceObject.super_IObject._vptr_IObject & 0x100000000) == 0)
          ) {
    BufferVkImpl::InvalidateMappedRange
              ((BufferVkImpl *)pBuffer,0,
               (Uint64)pBuffer[4].super_IDeviceObject.super_IObject._vptr_IObject);
    return;
  }
  return;
}

Assistant:

void DeviceContextVkImpl::UnmapBuffer(IBuffer* pBuffer, MAP_TYPE MapType)
{
    TDeviceContextBase::UnmapBuffer(pBuffer, MapType);
    BufferVkImpl* const pBufferVk = ClassPtrCast<BufferVkImpl>(pBuffer);
    const BufferDesc&   BuffDesc  = pBufferVk->GetDesc();

    if (MapType == MAP_READ)
    {
        if (BuffDesc.Usage == USAGE_STAGING || BuffDesc.Usage == USAGE_UNIFIED)
        {
            if ((pBufferVk->GetMemoryProperties() & MEMORY_PROPERTY_HOST_COHERENT) == 0)
            {
                pBufferVk->InvalidateMappedRange(0, BuffDesc.Size);
            }
        }
    }
    else if (MapType == MAP_WRITE)
    {
        if (BuffDesc.Usage == USAGE_STAGING || BuffDesc.Usage == USAGE_UNIFIED)
        {
            if ((pBufferVk->GetMemoryProperties() & MEMORY_PROPERTY_HOST_COHERENT) == 0)
            {
                pBufferVk->FlushMappedRange(0, BuffDesc.Size);
            }
        }
        else if (BuffDesc.Usage == USAGE_DYNAMIC)
        {
            if (pBufferVk->m_VulkanBuffer != VK_NULL_HANDLE)
            {
                const Uint32 DynamicBufferId = pBufferVk->GetDynamicBufferId();
                VERIFY(DynamicBufferId != ~0u, "Dynamic buffer '", BuffDesc.Name, "' does not have dynamic buffer ID");
                if (DynamicBufferId < m_MappedBuffers.size())
                {
                    VulkanDynamicAllocation& DynAlloc  = m_MappedBuffers[DynamicBufferId].Allocation;
                    VkBuffer                 vkSrcBuff = DynAlloc.pDynamicMemMgr->GetVkBuffer();
                    UpdateBufferRegion(pBufferVk, 0, BuffDesc.Size, vkSrcBuff, DynAlloc.AlignedOffset, RESOURCE_STATE_TRANSITION_MODE_TRANSITION);
                }
                else
                {
                    DEV_ERROR("Unmapping buffer '", BuffDesc.Name, "' that was not previously mapped.");
                }
            }
        }
    }
}